

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O3

void __thiscall re2c::Scanner::restore_state(Scanner *this,ScannerState *state)

{
  char **ppcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  
  pcVar2 = (this->super_ScannerState).bot;
  pcVar3 = state->bot;
  pcVar5 = (this->super_ScannerState).lim;
  pcVar6 = (this->super_ScannerState).top;
  pcVar4 = (this->super_ScannerState).eof;
  ScannerState::ScannerState(&this->super_ScannerState,state);
  if (pcVar2 != pcVar3) {
    lVar7 = (long)pcVar3 - (long)pcVar2;
    (this->super_ScannerState).tok = (this->super_ScannerState).tok + lVar7;
    ppcVar1 = &(this->super_ScannerState).ptr;
    *ppcVar1 = *ppcVar1 + lVar7;
    ppcVar1 = &(this->super_ScannerState).cur;
    *ppcVar1 = *ppcVar1 + lVar7;
    ppcVar1 = &(this->super_ScannerState).pos;
    *ppcVar1 = *ppcVar1 + lVar7;
    ppcVar1 = &(this->super_ScannerState).ctx;
    *ppcVar1 = *ppcVar1 + lVar7;
    (this->super_ScannerState).bot = pcVar2;
    (this->super_ScannerState).lim = pcVar5;
    (this->super_ScannerState).top = pcVar6;
    (this->super_ScannerState).eof = pcVar4;
  }
  return;
}

Assistant:

void Scanner::restore_state(const ScannerState& state)
{
	ptrdiff_t diff = bot - state.bot;
	char *old_bot = bot;
	char *old_lim = lim;
	char *old_top = top;
	char *old_eof = eof;
	*(ScannerState*)this = state;
	if (diff)
	{
		tok -= diff;
		ptr -= diff;
		cur -= diff;
		pos -= diff;
		ctx -= diff;		
		bot = old_bot;
		lim = old_lim;
		top = old_top;
		eof = old_eof;
	}
}